

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.cc
# Opt level: O2

void __thiscall
draco::GeometryAttribute::Init
          (GeometryAttribute *this,Type attribute_type,DataBuffer *buffer,uint8_t num_components,
          DataType data_type,bool normalized,int64_t byte_stride,int64_t byte_offset)

{
  int64_t iVar1;
  
  this->buffer_ = buffer;
  if (buffer != (DataBuffer *)0x0) {
    iVar1 = (buffer->descriptor_).buffer_update_count;
    (this->buffer_descriptor_).buffer_id = (buffer->descriptor_).buffer_id;
    (this->buffer_descriptor_).buffer_update_count = iVar1;
  }
  this->num_components_ = num_components;
  this->data_type_ = data_type;
  this->normalized_ = normalized;
  this->byte_stride_ = byte_stride;
  this->byte_offset_ = byte_offset;
  this->attribute_type_ = attribute_type;
  return;
}

Assistant:

void GeometryAttribute::Init(GeometryAttribute::Type attribute_type,
                             DataBuffer *buffer, uint8_t num_components,
                             DataType data_type, bool normalized,
                             int64_t byte_stride, int64_t byte_offset) {
  buffer_ = buffer;
  if (buffer) {
    buffer_descriptor_.buffer_id = buffer->buffer_id();
    buffer_descriptor_.buffer_update_count = buffer->update_count();
  }
  num_components_ = num_components;
  data_type_ = data_type;
  normalized_ = normalized;
  byte_stride_ = byte_stride;
  byte_offset_ = byte_offset;
  attribute_type_ = attribute_type;
}